

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O0

void __thiscall deqp::ub::ShaderInterface::~ShaderInterface(ShaderInterface *this)

{
  StructType *this_00;
  UniformBlock *this_01;
  bool bVar1;
  reference ppSVar2;
  reference ppUVar3;
  __normal_iterator<deqp::ub::UniformBlock_**,_std::vector<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>_>
  local_38;
  __normal_iterator<deqp::ub::UniformBlock_**,_std::vector<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>_>
  local_30;
  iterator i_1;
  __normal_iterator<deqp::ub::StructType_**,_std::vector<deqp::ub::StructType_*,_std::allocator<deqp::ub::StructType_*>_>_>
  local_20;
  __normal_iterator<deqp::ub::StructType_**,_std::vector<deqp::ub::StructType_*,_std::allocator<deqp::ub::StructType_*>_>_>
  local_18;
  iterator i;
  ShaderInterface *this_local;
  
  i._M_current = (StructType **)this;
  local_18._M_current =
       (StructType **)
       std::vector<deqp::ub::StructType_*,_std::allocator<deqp::ub::StructType_*>_>::begin
                 (&this->m_structs);
  while( true ) {
    local_20._M_current =
         (StructType **)
         std::vector<deqp::ub::StructType_*,_std::allocator<deqp::ub::StructType_*>_>::end
                   (&this->m_structs);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<deqp::ub::StructType_**,_std::vector<deqp::ub::StructType_*,_std::allocator<deqp::ub::StructType_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppSVar2;
    if (this_00 != (StructType *)0x0) {
      StructType::~StructType(this_00);
      operator_delete(this_00,0x38);
    }
    i_1._M_current =
         (UniformBlock **)
         __gnu_cxx::
         __normal_iterator<deqp::ub::StructType_**,_std::vector<deqp::ub::StructType_*,_std::allocator<deqp::ub::StructType_*>_>_>
         ::operator++(&local_18,0);
  }
  local_30._M_current =
       (UniformBlock **)
       std::vector<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>::begin
                 (&this->m_uniformBlocks);
  while( true ) {
    local_38._M_current =
         (UniformBlock **)
         std::vector<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>::end
                   (&this->m_uniformBlocks);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppUVar3 = __gnu_cxx::
              __normal_iterator<deqp::ub::UniformBlock_**,_std::vector<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>_>
              ::operator*(&local_30);
    this_01 = *ppUVar3;
    if (this_01 != (UniformBlock *)0x0) {
      UniformBlock::~UniformBlock(this_01);
      operator_delete(this_01,0x60);
    }
    __gnu_cxx::
    __normal_iterator<deqp::ub::UniformBlock_**,_std::vector<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>_>
    ::operator++(&local_30,0);
  }
  std::vector<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>::~vector
            (&this->m_uniformBlocks);
  std::vector<deqp::ub::StructType_*,_std::allocator<deqp::ub::StructType_*>_>::~vector
            (&this->m_structs);
  return;
}

Assistant:

ShaderInterface::~ShaderInterface(void)
{
	for (std::vector<StructType*>::iterator i = m_structs.begin(); i != m_structs.end(); i++)
		delete *i;

	for (std::vector<UniformBlock*>::iterator i = m_uniformBlocks.begin(); i != m_uniformBlocks.end(); i++)
		delete *i;
}